

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

mat4 * dja::transpose(mat4 *__return_storage_ptr__,mat4 *m)

{
  float_t m00;
  float_t m01;
  float_t m02;
  float_t m03;
  float_t m10;
  float_t m11;
  float_t m12;
  float_t m13;
  float_t m20;
  float_t m21;
  float_t m22;
  float_t m23;
  float_t m30;
  float_t m31;
  float_t m32;
  vec4 *pvVar1;
  float_t *pfVar2;
  mat4 *m_local;
  
  pvVar1 = mat4::operator[](m,0);
  pfVar2 = vec4::operator[](pvVar1,0);
  m00 = *pfVar2;
  pvVar1 = mat4::operator[](m,1);
  pfVar2 = vec4::operator[](pvVar1,0);
  m01 = *pfVar2;
  pvVar1 = mat4::operator[](m,2);
  pfVar2 = vec4::operator[](pvVar1,0);
  m02 = *pfVar2;
  pvVar1 = mat4::operator[](m,3);
  pfVar2 = vec4::operator[](pvVar1,0);
  m03 = *pfVar2;
  pvVar1 = mat4::operator[](m,0);
  pfVar2 = vec4::operator[](pvVar1,1);
  m10 = *pfVar2;
  pvVar1 = mat4::operator[](m,1);
  pfVar2 = vec4::operator[](pvVar1,1);
  m11 = *pfVar2;
  pvVar1 = mat4::operator[](m,2);
  pfVar2 = vec4::operator[](pvVar1,1);
  m12 = *pfVar2;
  pvVar1 = mat4::operator[](m,3);
  pfVar2 = vec4::operator[](pvVar1,1);
  m13 = *pfVar2;
  pvVar1 = mat4::operator[](m,0);
  pfVar2 = vec4::operator[](pvVar1,2);
  m20 = *pfVar2;
  pvVar1 = mat4::operator[](m,1);
  pfVar2 = vec4::operator[](pvVar1,2);
  m21 = *pfVar2;
  pvVar1 = mat4::operator[](m,2);
  pfVar2 = vec4::operator[](pvVar1,2);
  m22 = *pfVar2;
  pvVar1 = mat4::operator[](m,3);
  pfVar2 = vec4::operator[](pvVar1,2);
  m23 = *pfVar2;
  pvVar1 = mat4::operator[](m,0);
  pfVar2 = vec4::operator[](pvVar1,3);
  m30 = *pfVar2;
  pvVar1 = mat4::operator[](m,1);
  pfVar2 = vec4::operator[](pvVar1,3);
  m31 = *pfVar2;
  pvVar1 = mat4::operator[](m,2);
  pfVar2 = vec4::operator[](pvVar1,3);
  m32 = *pfVar2;
  pvVar1 = mat4::operator[](m,3);
  pfVar2 = vec4::operator[](pvVar1,3);
  mat4::mat4(__return_storage_ptr__,m00,m01,m02,m03,m10,m11,m12,m13,m20,m21,m22,m23,m30,m31,m32,
             *pfVar2);
  return __return_storage_ptr__;
}

Assistant:

mat4 transpose(const mat4& m)
{
    return mat4(M00(m), M10(m), M20(m), M30(m),
                M01(m), M11(m), M21(m), M31(m),
                M02(m), M12(m), M22(m), M32(m),
                M03(m), M13(m), M23(m), M33(m));
}